

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

int htmlCurrentChar(xmlParserCtxtPtr ctxt,int *len)

{
  byte bVar1;
  int iVar2;
  xmlChar *pxVar3;
  byte *pbVar4;
  xmlParserInputPtr pxVar5;
  xmlCharEncodingHandlerPtr handler;
  int val;
  xmlParserInputBufferPtr in_RCX;
  long lVar6;
  uint uVar7;
  char buffer [150];
  
  val = (int)in_RCX;
  if (ctxt->instate == XML_PARSER_EOF) {
    return 0;
  }
  if (ctxt->token != 0) {
    *len = 0;
    return ctxt->token;
  }
  if (ctxt->charset == 1) {
LAB_0014db1d:
    pxVar5 = ctxt->input;
    pbVar4 = pxVar5->cur;
    bVar1 = *pbVar4;
    if ((char)bVar1 < '\0') {
      if (((bVar1 & 0x40) != 0) && (pbVar4[1] == 0)) {
        xmlParserInputGrow(pxVar5,0xfa);
        pxVar5 = ctxt->input;
      }
      pbVar4 = pxVar5->cur;
      if ((long)pxVar5->end - (long)pbVar4 < 4) {
        snprintf(buffer,0x95,"Bytes: 0x%02X\n",(ulong)*pbVar4);
      }
      else {
        snprintf(buffer,0x95,"Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",(ulong)*pbVar4,(ulong)pbVar4[1],
                 (ulong)pbVar4[2],(uint)pbVar4[3]);
      }
      htmlParseErr(ctxt,XML_ERR_INVALID_ENCODING,"Input is not proper UTF-8, indicate encoding !\n",
                   (xmlChar *)buffer,(xmlChar *)0x0);
      pxVar5 = ctxt->input;
      if ((pxVar5->buf != (xmlParserInputBufferPtr)0x0) &&
         (pxVar5->buf->encoder == (xmlCharEncodingHandlerPtr)0x0)) {
        xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_8859_1);
        pxVar5 = ctxt->input;
      }
      *len = 1;
      pbVar4 = pxVar5->cur;
    }
    else {
      if ((bVar1 == 0) && (pbVar4 < pxVar5->end)) {
        htmlParseErrInt(ctxt,0x1e338a,(char *)0x0,val);
        *len = 1;
        goto LAB_0014db4f;
      }
      *len = 1;
    }
    uVar7 = (uint)*pbVar4;
  }
  else {
    pxVar5 = ctxt->input;
    pbVar4 = pxVar5->cur;
    if ((char)*pbVar4 < '\0') {
      if (((((pxVar5->encoding == (xmlChar *)0x0) &&
            (in_RCX = pxVar5->buf, in_RCX != (xmlParserInputBufferPtr)0x0)) &&
           (in_RCX->encoder == (xmlCharEncodingHandlerPtr)0x0)) &&
          ((pxVar5->end != (xmlChar *)0x0 && (*pxVar5->end == '\0')))) &&
         ((pxVar3 = xmlStrcasestr(pbVar4,(xmlChar *)"HTTP-EQUIV"), pxVar3 != (xmlChar *)0x0 &&
          ((pxVar3 = xmlStrcasestr(pxVar3,(xmlChar *)"CONTENT"), pxVar3 != (xmlChar *)0x0 &&
           (pxVar3 = xmlStrcasestr(pxVar3,(xmlChar *)"CHARSET="), pxVar3 != (xmlChar *)0x0)))))) {
        lVar6 = 0;
        in_RCX = (xmlParserInputBufferPtr)0x4000000002005;
        while (((bVar1 = pxVar3[lVar6 + 8], (byte)(bVar1 - 0x30) < 10 ||
                ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
               ((bVar1 - 0x2d < 0x33 &&
                ((0x4000000002005U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) != 0))))) {
          lVar6 = lVar6 + 1;
        }
        if (lVar6 == 0) goto LAB_0014db08;
        pxVar3 = xmlStrndup(pxVar3 + 8,(int)lVar6);
        val = (int)in_RCX;
        if (pxVar3 == (xmlChar *)0x0) goto LAB_0014db08;
        pxVar5 = ctxt->input;
        if (pxVar5->encoding != (xmlChar *)0x0) {
          (*xmlFree)(pxVar5->encoding);
          pxVar5 = ctxt->input;
        }
        pxVar5->encoding = pxVar3;
        handler = xmlFindCharEncodingHandler((char *)pxVar3);
        if (handler == (xmlCharEncodingHandlerPtr)0x0) {
          htmlParseErr(ctxt,XML_ERR_INVALID_ENCODING,"Unsupported encoding %s",pxVar3,(xmlChar *)0x0
                      );
          val = (int)pxVar3;
        }
        else {
          iVar2 = xmlStrEqual((xmlChar *)handler->name,"UTF-8");
          if (iVar2 == 0) {
            xmlSwitchToEncoding(ctxt,handler);
          }
        }
      }
      else {
LAB_0014db08:
        val = (int)in_RCX;
        xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_8859_1);
      }
      ctxt->charset = 1;
      goto LAB_0014db1d;
    }
    *len = 1;
    bVar1 = *pbVar4;
    if (bVar1 != 0) {
      return (uint)bVar1;
    }
    if (pxVar5->end <= pbVar4) {
      return (uint)bVar1;
    }
    htmlParseErrInt(ctxt,0x1e338a,(char *)0x0,val);
LAB_0014db4f:
    uVar7 = 0x20;
  }
  return uVar7;
}

Assistant:

static int
htmlCurrentChar(xmlParserCtxtPtr ctxt, int *len) {
    const unsigned char *cur;
    unsigned char c;
    unsigned int val;

    if (ctxt->instate == XML_PARSER_EOF)
	return(0);

    if (ctxt->token != 0) {
	*len = 0;
	return(ctxt->token);
    }
    if (ctxt->charset != XML_CHAR_ENCODING_UTF8) {
        xmlChar * guess;
        xmlCharEncodingHandlerPtr handler;

        /*
         * Assume it's a fixed length encoding (1) with
         * a compatible encoding for the ASCII set, since
         * HTML constructs only use < 128 chars
         */
        if (*ctxt->input->cur < 0x80) {
            *len = 1;
            if ((*ctxt->input->cur == 0) &&
                (ctxt->input->cur < ctxt->input->end)) {
                htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                                "Char 0x%X out of allowed range\n", 0);
                return(' ');
            }
            return(*ctxt->input->cur);
        }

        /*
         * Humm this is bad, do an automatic flow conversion
         */
        guess = htmlFindEncoding(ctxt);
        if (guess == NULL) {
            xmlSwitchEncoding(ctxt, XML_CHAR_ENCODING_8859_1);
        } else {
            if (ctxt->input->encoding != NULL)
                xmlFree((xmlChar *) ctxt->input->encoding);
            ctxt->input->encoding = guess;
            handler = xmlFindCharEncodingHandler((const char *) guess);
            if (handler != NULL) {
                /*
                 * Don't use UTF-8 encoder which isn't required and
                 * can produce invalid UTF-8.
                 */
                if (!xmlStrEqual(BAD_CAST handler->name, BAD_CAST "UTF-8"))
                    xmlSwitchToEncoding(ctxt, handler);
            } else {
                htmlParseErr(ctxt, XML_ERR_INVALID_ENCODING,
                             "Unsupported encoding %s", guess, NULL);
            }
        }
        ctxt->charset = XML_CHAR_ENCODING_UTF8;
    }

    /*
     * We are supposed to handle UTF8, check it's valid
     * From rfc2044: encoding of the Unicode values on UTF-8:
     *
     * UCS-4 range (hex.)           UTF-8 octet sequence (binary)
     * 0000 0000-0000 007F   0xxxxxxx
     * 0000 0080-0000 07FF   110xxxxx 10xxxxxx
     * 0000 0800-0000 FFFF   1110xxxx 10xxxxxx 10xxxxxx
     *
     * Check for the 0x110000 limit too
     */
    cur = ctxt->input->cur;
    c = *cur;
    if (c & 0x80) {
        if ((c & 0x40) == 0)
            goto encoding_error;
        if (cur[1] == 0) {
            xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
            cur = ctxt->input->cur;
        }
        if ((cur[1] & 0xc0) != 0x80)
            goto encoding_error;
        if ((c & 0xe0) == 0xe0) {

            if (cur[2] == 0) {
                xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
                cur = ctxt->input->cur;
            }
            if ((cur[2] & 0xc0) != 0x80)
                goto encoding_error;
            if ((c & 0xf0) == 0xf0) {
                if (cur[3] == 0) {
                    xmlParserInputGrow(ctxt->input, INPUT_CHUNK);
                    cur = ctxt->input->cur;
                }
                if (((c & 0xf8) != 0xf0) ||
                    ((cur[3] & 0xc0) != 0x80))
                    goto encoding_error;
                /* 4-byte code */
                *len = 4;
                val = (cur[0] & 0x7) << 18;
                val |= (cur[1] & 0x3f) << 12;
                val |= (cur[2] & 0x3f) << 6;
                val |= cur[3] & 0x3f;
                if (val < 0x10000)
                    goto encoding_error;
            } else {
              /* 3-byte code */
                *len = 3;
                val = (cur[0] & 0xf) << 12;
                val |= (cur[1] & 0x3f) << 6;
                val |= cur[2] & 0x3f;
                if (val < 0x800)
                    goto encoding_error;
            }
        } else {
          /* 2-byte code */
            *len = 2;
            val = (cur[0] & 0x1f) << 6;
            val |= cur[1] & 0x3f;
            if (val < 0x80)
                goto encoding_error;
        }
        if (!IS_CHAR(val)) {
            htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                            "Char 0x%X out of allowed range\n", val);
        }
        return(val);
    } else {
        if ((*ctxt->input->cur == 0) &&
            (ctxt->input->cur < ctxt->input->end)) {
            htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                            "Char 0x%X out of allowed range\n", 0);
            *len = 1;
            return(' ');
        }
        /* 1-byte code */
        *len = 1;
        return(*ctxt->input->cur);
    }

encoding_error:
    /*
     * If we detect an UTF8 error that probably mean that the
     * input encoding didn't get properly advertised in the
     * declaration header. Report the error and switch the encoding
     * to ISO-Latin-1 (if you don't like this policy, just declare the
     * encoding !)
     */
    {
        char buffer[150];

	if (ctxt->input->end - ctxt->input->cur >= 4) {
	    snprintf(buffer, 149, "Bytes: 0x%02X 0x%02X 0x%02X 0x%02X\n",
			    ctxt->input->cur[0], ctxt->input->cur[1],
			    ctxt->input->cur[2], ctxt->input->cur[3]);
	} else {
	    snprintf(buffer, 149, "Bytes: 0x%02X\n", ctxt->input->cur[0]);
	}
	htmlParseErr(ctxt, XML_ERR_INVALID_ENCODING,
		     "Input is not proper UTF-8, indicate encoding !\n",
		     BAD_CAST buffer, NULL);
    }

    /*
     * Don't switch encodings twice. Note that if there's an encoder, we
     * shouldn't receive invalid UTF-8 anyway.
     *
     * Note that if ctxt->input->buf == NULL, switching encodings is
     * impossible, see Gitlab issue #34.
     */
    if ((ctxt->input->buf != NULL) &&
        (ctxt->input->buf->encoder == NULL))
        xmlSwitchEncoding(ctxt, XML_CHAR_ENCODING_8859_1);
    *len = 1;
    return(*ctxt->input->cur);
}